

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
ClearAllocators(HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  code *pcVar1;
  bool bVar2;
  Recycler *this_00;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  undefined4 *puVar3;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *smallBlock;
  HeapBlock *heapBlock;
  FreeObject *freeObject;
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this_local;
  
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::
  ForEachAllocator<Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::ClearAllocators()::_lambda(Memory::SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>*)_1_>
            ();
  heapBlock = (HeapBlock *)this->explicitFreeList;
  do {
    if (heapBlock == (HeapBlock *)0x0) {
      this->explicitFreeList = (FreeObject *)0x0;
      return;
    }
    this_00 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    this_01 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
              Recycler::FindHeapBlock(this_00,heapBlock);
    if (this_01 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x109,"(heapBlock != nullptr)","heapBlock != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = HeapBlock::IsLargeHeapBlock((HeapBlock *)this_01);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x10a,"(!heapBlock->IsLargeHeapBlock())","!heapBlock->IsLargeHeapBlock()")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearExplicitFreeBitForObject
              (this_01,heapBlock);
    heapBlock = (HeapBlock *)FreeObject::GetNext((FreeObject *)heapBlock);
  } while( true );
}

Assistant:

void
HeapBucketT<TBlockType>::ClearAllocators()
{
    ForEachAllocator([](TBlockAllocatorType * allocator) { ClearAllocator(allocator); });

#ifdef RECYCLER_PAGE_HEAP

#endif

#ifdef RECYCLER_MEMORY_VERIFY
    FreeObject* freeObject = this->explicitFreeList;

    while (freeObject)
    {
        HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock((void*)freeObject);
        Assert(heapBlock != nullptr);
        Assert(!heapBlock->IsLargeHeapBlock());
        TBlockType* smallBlock = (TBlockType*)heapBlock;

        smallBlock->ClearExplicitFreeBitForObject((void*)freeObject);
        freeObject = freeObject->GetNext();
    }
#endif

    this->explicitFreeList = nullptr;
}